

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::re2_internal::Parse<unsigned_int>(char *str,size_t n,uint *dest,int radix)

{
  bool bVar1;
  ulong local_38;
  unsigned_long r;
  uint *puStack_28;
  int radix_local;
  uint *dest_local;
  size_t n_local;
  char *str_local;
  
  r._4_4_ = radix;
  puStack_28 = dest;
  dest_local = (uint *)n;
  n_local = (size_t)str;
  bVar1 = Parse<unsigned_long>(str,n,&local_38,radix);
  if (bVar1) {
    if ((local_38 & 0xffffffff) == local_38) {
      if (puStack_28 == (uint *)0x0) {
        str_local._7_1_ = true;
      }
      else {
        *puStack_28 = (uint)local_38;
        str_local._7_1_ = true;
      }
    }
    else {
      str_local._7_1_ = false;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool Parse(const char* str, size_t n, unsigned int* dest, int radix) {
  unsigned long r;
  if (!Parse(str, n, &r, radix)) return false;  // Could not parse
  if ((unsigned int)r != r) return false;       // Out of range
  if (dest == NULL) return true;
  *dest = (unsigned int)r;
  return true;
}